

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_GetCommandLineFlagInfoTest_FlagDoesNotExist::Run(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  undefined8 extraout_RAX;
  FlagSaver fs;
  FlagSaver FStack_108;
  CommandLineFlagInfo local_100;
  
  FlagSaver::FlagSaver(&FStack_108);
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineFlagInfoTest","FlagDoesNotExist");
  local_100.name._M_dataplus._M_p = (pointer)&local_100.name.field_2;
  local_100.name._M_string_length = 0;
  local_100.name.field_2._M_local_buf[0] = '\0';
  local_100.type._M_dataplus._M_p = (pointer)&local_100.type.field_2;
  local_100.type._M_string_length = 0;
  local_100.type.field_2._M_local_buf[0] = '\0';
  local_100.description._M_dataplus._M_p = (pointer)&local_100.description.field_2;
  local_100.description._M_string_length = 0;
  local_100.description.field_2._M_local_buf[0] = '\0';
  local_100.current_value._M_dataplus._M_p = (pointer)&local_100.current_value.field_2;
  local_100.current_value._M_string_length = 0;
  local_100.current_value.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_100.default_value.field_2;
  local_100.default_value._M_string_length = 0;
  local_100.default_value.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_100.filename.field_2;
  local_100.filename._M_string_length = 0;
  local_100.filename.field_2._M_local_buf[0] = '\0';
  local_100.default_value._M_dataplus._M_p = (pointer)paVar1;
  local_100.filename._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_replace((ulong)&local_100,0,(char *)0x0,0x1507c7);
  std::__cxx11::string::_M_replace
            ((ulong)&local_100.type,0,(char *)local_100.type._M_string_length,0x1507d9);
  std::__cxx11::string::_M_replace
            ((ulong)&local_100.current_value,0,(char *)local_100.current_value._M_string_length,
             0x1508a7);
  std::__cxx11::string::_M_replace
            ((ulong)&local_100.default_value,0,(char *)local_100.default_value._M_string_length,
             0x1508ac);
  std::__cxx11::string::_M_replace
            ((ulong)&local_100.filename,0,(char *)local_100.filename._M_string_length,0x1508b0);
  local_100.has_validator_fn = true;
  local_100.is_default = false;
  local_100.flag_ptr = (void *)0x0;
  bVar3 = GetCommandLineFlagInfo("test_int3210",&local_100);
  if (bVar3) {
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagDoesNotExist::Run();
LAB_00138aff:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagDoesNotExist::Run();
LAB_00138b04:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagDoesNotExist::Run();
LAB_00138b09:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagDoesNotExist::Run();
LAB_00138b0e:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagDoesNotExist::Run();
LAB_00138b13:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagDoesNotExist::Run();
LAB_00138b18:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagDoesNotExist::Run();
LAB_00138b1d:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagDoesNotExist::Run();
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_100);
    if (iVar4 != 0) goto LAB_00138aff;
    iVar4 = std::__cxx11::string::compare((char *)&local_100.type);
    if (iVar4 != 0) goto LAB_00138b04;
    iVar4 = std::__cxx11::string::compare((char *)&local_100.description);
    if (iVar4 != 0) goto LAB_00138b09;
    iVar4 = std::__cxx11::string::compare((char *)&local_100.current_value);
    if (iVar4 != 0) goto LAB_00138b0e;
    iVar4 = std::__cxx11::string::compare((char *)&local_100.default_value);
    if (iVar4 != 0) goto LAB_00138b13;
    iVar4 = std::__cxx11::string::compare((char *)&local_100.filename);
    if (iVar4 != 0) goto LAB_00138b18;
    if (local_100.is_default == true) goto LAB_00138b1d;
    if (local_100.has_validator_fn != false) {
      if (local_100.flag_ptr == (void *)0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.filename._M_dataplus._M_p != paVar2) {
          operator_delete(local_100.filename._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.default_value._M_dataplus._M_p != paVar1) {
          operator_delete(local_100.default_value._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.current_value._M_dataplus._M_p != &local_100.current_value.field_2) {
          operator_delete(local_100.current_value._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.description._M_dataplus._M_p != &local_100.description.field_2) {
          operator_delete(local_100.description._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.type._M_dataplus._M_p != &local_100.type.field_2) {
          operator_delete(local_100.type._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.name._M_dataplus._M_p != &local_100.name.field_2) {
          operator_delete(local_100.name._M_dataplus._M_p);
        }
        FlagSaver::~FlagSaver(&FStack_108);
        return;
      }
      goto LAB_00138b27;
    }
  }
  _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagDoesNotExist::Run();
LAB_00138b27:
  _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagDoesNotExist::Run();
  CommandLineFlagInfo::~CommandLineFlagInfo(&local_100);
  FlagSaver::~FlagSaver(&FStack_108);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(GetCommandLineFlagInfoTest, FlagDoesNotExist) {
  CommandLineFlagInfo info;
  // Set to some random values that GetCommandLineFlagInfo should not change
  info.name = "name";
  info.type = "type";
  info.current_value = "curr";
  info.default_value = "def";
  info.filename = "/";
  info.is_default = false;
  info.has_validator_fn = true;
  info.flag_ptr = NULL;
  bool r = GetCommandLineFlagInfo("test_int3210", &info);
  EXPECT_FALSE(r);
  EXPECT_EQ("name", info.name);
  EXPECT_EQ("type", info.type);
  EXPECT_EQ("", info.description);
  EXPECT_EQ("curr", info.current_value);
  EXPECT_EQ("def", info.default_value);
  EXPECT_EQ("/", info.filename);
  EXPECT_FALSE(info.is_default);
  EXPECT_TRUE(info.has_validator_fn);
  EXPECT_EQ(NULL, info.flag_ptr);
}